

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O1

DBaseDecal * __thiscall
DBaseDecal::CloneSelf
          (DBaseDecal *this,FDecalTemplate *tpl,double ix,double iy,double iz,side_t *wall,
          F3DFloor *ffloor)

{
  FTextureID FVar1;
  DBaseDecal *this_00;
  
  this_00 = (DBaseDecal *)
            M_Malloc_Dbg(0x98,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                         ,0x1f9);
  DThinker::DThinker((DThinker *)this_00,1);
  (this_00->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00709da8;
  this_00->WallNext = (DBaseDecal *)0x0;
  this_00->WallPrev = (DBaseDecal *)0x0;
  this_00->LeftDistance = 0.0;
  this_00->Z = iz;
  this_00->ScaleX = 1.0;
  this_00->ScaleY = 1.0;
  this_00->Alpha = 1.0;
  this_00->AlphaColor = 0;
  this_00->Translation = 0;
  this_00->RenderFlags = 0;
  this_00->Side = (side_t *)0x0;
  this_00->Sector = (sector_t_conflict *)0x0;
  this_00->RenderStyle = LegacyRenderStyles[0];
  (this_00->PicNum).texnum = -1;
  FVar1 = StickToWall(this_00,wall,ix,iy,ffloor);
  if (FVar1.texnum < 1) {
    (*(this_00->super_DThinker).super_DObject._vptr_DObject[4])(this_00);
    this_00 = (DBaseDecal *)0x0;
  }
  else {
    FDecalTemplate::ApplyToDecal(tpl,this_00,wall);
    this_00->AlphaColor = this->AlphaColor;
    this_00->RenderFlags = this->RenderFlags & 0xfffff0ff | this_00->RenderFlags & 0xf00;
  }
  return this_00;
}

Assistant:

DBaseDecal *DBaseDecal::CloneSelf (const FDecalTemplate *tpl, double ix, double iy, double iz, side_t *wall, F3DFloor * ffloor) const
{
	DBaseDecal *decal = new DBaseDecal(iz);
	if (decal != NULL)
	{
		if (decal->StickToWall (wall, ix, iy, ffloor).isValid())
		{
			tpl->ApplyToDecal (decal, wall);
			decal->AlphaColor = AlphaColor;
			decal->RenderFlags = (decal->RenderFlags & RF_DECALMASK) |
								 (this->RenderFlags & ~RF_DECALMASK);
		}
		else
		{
			decal->Destroy();
			return NULL;
		}
	}
	return decal;
}